

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O0

int raw_decode(opj_raw_t *raw)

{
  int d;
  opj_raw_t *raw_local;
  
  if (raw->ct == 0) {
    raw->ct = 8;
    if (raw->len == raw->lenmax) {
      raw->c = 0xff;
    }
    else {
      if (raw->c == 0xff) {
        raw->ct = 7;
      }
      raw->c = raw->start[raw->len];
      raw->len = raw->len + 1;
    }
  }
  raw->ct = raw->ct - 1;
  return (int)(uint)raw->c >> ((byte)raw->ct & 0x1f) & 1;
}

Assistant:

int raw_decode(opj_raw_t *raw) {
	int d;
	if (raw->ct == 0) {
		raw->ct = 8;
		if (raw->len == raw->lenmax) {
			raw->c = 0xff;
		} else {
			if (raw->c == 0xff) {
				raw->ct = 7;
			}
			raw->c = *(raw->start + raw->len);
			raw->len++;
		}
	}
	raw->ct--;
	d = (raw->c >> raw->ct) & 0x01;
	
	return d;
}